

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::loadstart(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  _Rb_tree_header *p_Var1;
  uint uVar2;
  iterator iVar3;
  Cell u;
  
  requireDStackDepth(this,1,"LOADSTART");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  u = uVar2;
  ForthStack<unsigned_int>::pop(this_00);
  if (uVar2 != 0) {
    iVar3 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>,_std::_Select1st<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
            ::find(&(this->blocksInProcess)._M_t,&u);
    p_Var1 = &(this->blocksInProcess)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)iVar3._M_node == p_Var1) {
      ForthStack<unsigned_int>::push(this_00,u);
      block(this);
      ForthStack<unsigned_int>::pop(this_00);
    }
    iVar3 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>,_std::_Select1st<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cppforth::Forth::BlockInfo>_>_>
            ::find(&(this->blocksInProcess)._M_t,&u);
    if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
      SaveInput(this);
      this->sourceid = 0;
      setDataCell(this,this->VarOffsetBlkAddress,u);
      setSourceVariables(this,*(Cell *)&iVar3._M_node[1]._M_parent,0x400,0);
      this->InterpretState = InterpretSource;
    }
  }
  return;
}

Assistant:

void loadstart(){
			REQUIRE_DSTACK_DEPTH(1, "LOADSTART");
			Cell u = dStack.getTop(); pop();
			if(u>0){
				auto foundIt = blocksInProcess.find(u);
				if (foundIt == blocksInProcess.end()) {
					push(u);
					block();
					pop();
				}
				foundIt = blocksInProcess.find(u);
				if (foundIt != blocksInProcess.end()) {
					SaveInput();
					setSourceId(0);
					setDataCell(VarOffsetBlkAddress, Cell(u)); // set BLK=u
					setSourceVariables((*foundIt).second.blockLocation, 1024, 0);
					InterpretState = InterpretSource;
				} 
			}
		}